

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall InterpreterTest_SubF32_Test::TestBody(InterpreterTest_SubF32_Test *this)

{
  char *message;
  char *in_R9;
  pointer *__ptr;
  initializer_list<wasm::Literal> __l;
  undefined1 local_588 [8];
  Module wasm;
  IRBuilder builder;
  anon_union_16_6_1532cd5a_for_Literal_0 local_e0;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  Result<wasm::Expression_*> expr;
  __index_type local_a8;
  AssertHelper local_a0;
  undefined1 auStack_98 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> expected;
  __index_type local_78;
  undefined1 local_60 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> results;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined8 local_38;
  AssertHelper local_30;
  
  ::wasm::Module::Module((Module *)local_588);
  builder.wasm = (Module *)0x0;
  builder.debugLoc.
  super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Variant_storage_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  ._M_u._12_1_ = 0;
  builder.debugLoc.
  super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Variant_storage_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  ._16_8_ = 0;
  builder.scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  builder.scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)&builder.labelDepths._M_h._M_rehash_policy._M_next_resize;
  builder.builder.wasm = (Module *)0x0;
  builder.binaryPos = (size_t *)0x0;
  builder.lastBinaryPos = 0;
  builder.labelDepths._M_h._M_buckets = (__buckets_ptr)0x1;
  builder.labelDepths._M_h._M_bucket_count = 0;
  builder.labelDepths._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  builder.labelDepths._M_h._M_element_count._0_4_ = 0x3f800000;
  builder.labelDepths._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  builder.labelDepths._M_h._M_rehash_policy._4_4_ = 0;
  builder.labelDepths._M_h._M_rehash_policy._M_next_resize = 0;
  builder.labelDepths._M_h._M_single_bucket = (__node_base_ptr)0x0;
  builder.blockHint = 0x3f800000;
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)local_588;
  builder.func = (Function *)local_588;
  ::wasm::IRBuilder::makeConst(_local_588);
  local_c8[0] = local_78 != '\x01';
  _expr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_98);
  ::wasm::Literal::~Literal((Literal *)&builder.blockHint);
  if ((internal)local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_98,(internal *)local_c8,
               (AssertionResult *)"builder.makeConst(Literal(float(1.0))).getErr()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
               ,0x25f,(char *)auStack_98);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)local_60);
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_expr !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&expr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            _expr);
    }
    local_e0.i32 = 0x40000000;
    local_d0 = 4;
    ::wasm::IRBuilder::makeConst(_local_588);
    local_c8[0] = local_78 != '\x01';
    _expr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_98);
    ::wasm::Literal::~Literal((Literal *)&local_e0.func);
    if ((internal)local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)auStack_98,(internal *)local_c8,
                 (AssertionResult *)"builder.makeConst(Literal(float(2.0))).getErr()","true","false"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                 ,0x260,(char *)auStack_98);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Message *)local_60);
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_expr !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&expr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              _expr);
      }
      ::wasm::IRBuilder::makeBinary((BinaryOp)auStack_98);
      local_c8[0] = local_78 != '\x01';
      _expr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_98);
      if ((internal)local_c8[0] != (internal)0x0) {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_expr !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&expr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )_expr);
        }
        ::wasm::IRBuilder::build();
        local_60[0] = (internal)(local_a8 != '\x01');
        results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        if (local_a8 == '\x01') {
          testing::Message::Message
                    ((Message *)
                     &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)auStack_98,(internal *)local_60,(AssertionResult *)"expr.getErr()",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                     ,0x264,(char *)auStack_98);
          testing::internal::AssertHelper::operator=
                    (&local_30,
                     (Message *)
                     &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          if (auStack_98 !=
              (undefined1  [8])
              &expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish) {
            operator_delete((void *)auStack_98,
                            (ulong)((long)&(expected.
                                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->field_0 + 1
                                   ));
          }
          if ((long *)CONCAT44(results.
                               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               results.
                               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(results.
                                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                           results.
                                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_)
                        + 8))();
          }
          if (results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&results,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                         _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          auStack_98 = (undefined1  [8])0x0;
          expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ::wasm::Interpreter::runTest((Expression *)local_60);
          std::vector<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>::
          ~vector((vector<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
                   *)&expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_>::~vector
                    ((vector<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_> *)
                     auStack_98);
          results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 0xbf800000;
          local_38 = 4;
          __l._M_len = 1;
          __l._M_array = (iterator)
                         &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_98,__l,
                     (allocator_type *)&local_30);
          ::wasm::Literal::~Literal
                    ((Literal *)
                     &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::internal::
          CmpHelperEQ<std::vector<wasm::Literal,std::allocator<wasm::Literal>>,std::vector<wasm::Literal,std::allocator<wasm::Literal>>>
                    ((internal *)
                     &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,"results","expected",
                     (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_60,
                     (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_98);
          if ((char)results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
            testing::Message::Message((Message *)&local_30);
            if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              message = "";
            }
            else {
              message = (local_40->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                       ,0x269,message);
            testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_30);
            testing::internal::AssertHelper::~AssertHelper(&local_a0);
            if (local_30.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_30.data_ + 8))();
            }
          }
          if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_40,local_40);
          }
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_98);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_60);
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_c8);
        goto LAB_001878c6;
      }
      testing::Message::Message((Message *)local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)auStack_98,(internal *)local_c8,
                 (AssertionResult *)"builder.makeBinary(SubFloat32).getErr()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                 ,0x261,(char *)auStack_98);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Message *)local_60);
    }
  }
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)
             &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (auStack_98 !=
      (undefined1  [8])
      &expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_98,
                    (ulong)((long)&(expected.
                                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->field_0 + 1));
  }
  if ((long *)CONCAT71(local_60._1_7_,local_60[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_60._1_7_,local_60[0]) + 8))();
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_expr !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&expr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_expr
                );
  }
LAB_001878c6:
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&builder.scopeStack.
                    super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::~vector
            ((vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_> *)
             ((long)&builder.debugLoc.
                     super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                     .
                     super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                     .
                     super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                     .
                     super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                     .
                     super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
             + 0x10));
  ::wasm::Module::~Module((Module *)local_588);
  return;
}

Assistant:

TEST(InterpreterTest, SubF32) {
  Module wasm;
  IRBuilder builder(wasm);

  ASSERT_FALSE(builder.makeConst(Literal(float(1.0))).getErr());
  ASSERT_FALSE(builder.makeConst(Literal(float(2.0))).getErr());
  ASSERT_FALSE(builder.makeBinary(SubFloat32).getErr());

  auto expr = builder.build();
  ASSERT_FALSE(expr.getErr());

  auto results = Interpreter{}.runTest(*expr);
  std::vector<Literal> expected{Literal(float(-1.0))};

  EXPECT_EQ(results, expected);
}